

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O1

WebSocketMsg __thiscall asl::WebSocket::receive(WebSocket *this)

{
  AtomicCount *pAVar1;
  SmartObject_ *pSVar2;
  bool bVar3;
  Array<unsigned_char> AVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  ulong uVar9;
  long lVar10;
  WebSocket *in_RSI;
  int in_R8D;
  uint uVar11;
  bool bVar12;
  ByteArray buffer;
  WebSocketMsg msg;
  byte mlen;
  byte b0;
  uint mask;
  unsigned_short x;
  byte by [4];
  Array<unsigned_char> local_58;
  Array<unsigned_char> local_50;
  byte local_46;
  byte local_45;
  undefined4 local_44;
  uint local_40 [2];
  uint local_38;
  uint local_34;
  
  bVar12 = false;
  Array<unsigned_char>::alloc(&local_50,0);
  do {
    if (bVar12) {
      WebSocketMsg::fix((WebSocketMsg *)&local_50);
      (this->_socket).super_SmartObject._p = (SmartObject_ *)local_50._a;
      LOCK();
      ((AtomicCount *)(local_50._a + -8))->n = ((AtomicCount *)(local_50._a + -8))->n + 1;
      UNLOCK();
      break;
    }
    Array<unsigned_char>::alloc(&local_58,0);
    if (in_RSI->_closed == false) {
      iVar6 = (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[5])();
      if ((char)iVar6 != '\0') {
        in_RSI->_closed = true;
        (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[0xb])();
        goto LAB_00129674;
      }
      (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[0xc])();
      pSVar2 = (in_RSI->_socket).super_SmartObject._p;
      (*pSVar2->_vptr_SmartObject_[0xd])(pSVar2,&local_45,1);
      pSVar2 = (in_RSI->_socket).super_SmartObject._p;
      (*pSVar2->_vptr_SmartObject_[0xd])(pSVar2,&local_46,1);
      if (in_RSI->_closed != false) {
LAB_00129706:
        WebSocketMsg::fix((WebSocketMsg *)&local_50);
        goto LAB_0012967e;
      }
      iVar6 = (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[5])();
      bVar5 = local_46;
      if ((char)iVar6 != '\0') {
        in_RSI->_closed = true;
        (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[0xb])();
        goto LAB_00129706;
      }
      local_38 = (uint)local_45;
      uVar11 = local_46 & 0x7f;
      if (uVar11 == 0x7e) {
        Socket::operator>>(&in_RSI->_socket,(unsigned_short *)local_40);
        uVar11 = local_40[0] & 0xffff;
      }
      else if ((char)uVar11 == '\x7f') {
        Socket::operator>>(&in_RSI->_socket,(longlong *)local_40);
        uVar11 = local_40[0];
      }
      local_44 = 0;
      if ((char)bVar5 < '\0') {
        Socket::operator>>(&in_RSI->_socket,&local_44);
      }
      lVar10 = (long)(int)uVar11 +
               (long)*(int *)&((SmartObject_ *)(local_58._a + -0x10))->_vptr_SmartObject_;
      iVar6 = (int)lVar10;
      Array<unsigned_char>::reserve(&local_58,iVar6);
      *(int *)&((SmartObject_ *)(local_58._a + -0x10))->_vptr_SmartObject_ = iVar6;
      if (0 < (int)uVar11) {
        pSVar2 = (in_RSI->_socket).super_SmartObject._p;
        (*pSVar2->_vptr_SmartObject_[0xd])
                  (pSVar2,local_58._a + (lVar10 - (ulong)uVar11),(ulong)uVar11);
      }
      if ((char)bVar5 < '\0') {
        local_40[0] = local_44;
        lVar10 = 4;
        puVar8 = &local_34;
        do {
          *(undefined1 *)puVar8 = *(undefined1 *)((long)local_40 + lVar10 + -1);
          puVar8 = (uint *)((long)puVar8 + 1);
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
        local_44 = local_34;
        iVar6 = *(int *)&((SmartObject_ *)(local_58._a + -0x10))->_vptr_SmartObject_;
        Array<unsigned_char>::reserve(&local_58,iVar6 + 4);
        *(int *)&((SmartObject_ *)(local_58._a + -0x10))->_vptr_SmartObject_ = iVar6 + 4;
        Array<unsigned_char>::reserve(&local_58,iVar6);
        *(int *)&((SmartObject_ *)(local_58._a + -0x10))->_vptr_SmartObject_ = iVar6;
        if (-4 < iVar6) {
          iVar7 = iVar6 + 3;
          if (-1 < iVar6) {
            iVar7 = iVar6;
          }
          uVar9 = 0;
          do {
            *(uint *)(local_58._a + uVar9 * 4) = *(uint *)(local_58._a + uVar9 * 4) ^ local_44;
            uVar9 = uVar9 + 1;
          } while ((iVar7 >> 2) + 1 != uVar9);
        }
      }
      switch(local_38 & 0xf) {
      case 0:
      case 1:
      case 2:
        Array<unsigned_char>::append(&local_50,&local_58);
        break;
      case 8:
        if (1 < *(int *)&((SmartObject_ *)(local_58._a + -0x10))->_vptr_SmartObject_) {
          in_RSI->_code = (uint)(ushort)(*(ushort *)local_58._a << 8 | *(ushort *)local_58._a >> 8);
          Array<unsigned_char>::remove(&local_58,(char *)0x0);
          AVar4._a = local_58._a;
          LOCK();
          ((AtomicCount *)(local_58._a + -8))->n = ((AtomicCount *)(local_58._a + -8))->n + 1;
          UNLOCK();
          if (local_50._a != local_58._a) {
            LOCK();
            pAVar1 = (AtomicCount *)(local_50._a + -8);
            pAVar1->n = pAVar1->n + -1;
            UNLOCK();
            if (pAVar1->n == 0) {
              free((SmartObject_ *)(local_50._a + -0x10));
            }
            local_50._a = AVar4._a;
            LOCK();
            ((AtomicCount *)(AVar4._a + -8))->n = ((AtomicCount *)(AVar4._a + -8))->n + 1;
            UNLOCK();
          }
          pAVar1 = (AtomicCount *)(AVar4._a + -8);
          LOCK();
          pAVar1->n = pAVar1->n + -1;
          UNLOCK();
          if (pAVar1->n == 0) {
            free((SmartObject_ *)(AVar4._a + -0x10));
          }
        }
        in_RSI->_closed = true;
        bVar12 = true;
        (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[0xb])();
        break;
      case 9:
        send(in_RSI,(int)local_58._a,
             (void *)(ulong)*(uint *)&((SmartObject_ *)(local_58._a + -0x10))->_vptr_SmartObject_,10
             ,in_R8D);
        break;
      case 10:
        Array<unsigned_char>::reserve(&local_58,0);
        *(undefined4 *)&((SmartObject_ *)(local_58._a + -0x10))->_vptr_SmartObject_ = 0;
      }
      if ((char)local_38 < '\0') {
        bVar12 = true;
      }
      bVar3 = true;
    }
    else {
LAB_00129674:
      WebSocketMsg::fix((WebSocketMsg *)&local_50);
LAB_0012967e:
      (this->_socket).super_SmartObject._p = (SmartObject_ *)local_50._a;
      LOCK();
      ((AtomicCount *)(local_50._a + -8))->n = ((AtomicCount *)(local_50._a + -8))->n + 1;
      UNLOCK();
      bVar3 = false;
    }
    LOCK();
    pAVar1 = (AtomicCount *)(local_58._a + -8);
    pAVar1->n = pAVar1->n + -1;
    UNLOCK();
    if (pAVar1->n == 0) {
      free((SmartObject_ *)(local_58._a + -0x10));
      local_58._a = (uchar *)0x0;
    }
  } while (bVar3);
  LOCK();
  pAVar1 = (AtomicCount *)(local_50._a + -8);
  pAVar1->n = pAVar1->n + -1;
  UNLOCK();
  if (pAVar1->n == 0) {
    free((SmartObject_ *)(local_50._a + -0x10));
  }
  return (WebSocketMsg)(ByteArray)this;
}

Assistant:

WebSocketMsg WebSocket::receive()
{
	WebSocketMsg msg;
	bool haveMsg = false;
	while (!haveMsg)
	{
		ByteArray buffer;
		byte b0, mlen;
		DEBUG_LOG("receive\n");
		if (closed()) {
			return msg.fix();
		}
		DEBUG_LOG("avail %i\n", _socket.available());
		_socket >> b0 >> mlen;
		DEBUG_LOG("%i %i\n", b0, mlen);
		if (closed()) {
			return msg.fix();
		}
		bool fin = !!(b0 & 0x80);
		int opcode = b0 & 0x0f;
		bool masked = !!(mlen & 0x80);
		int len = mlen & 0x7f;
		if (len == 126)
		{
			len = _socket.read<unsigned short>();
		}
		else if (len == 127)
			len = (int)_socket.read<Long>(); // what if length larger than int?

		unsigned mask = 0;
		if (masked)
			_socket >> mask;

		buffer.resize(buffer.length() + len);
		if (len > 0)
			_socket.read(buffer.data() + buffer.length() - len, len);

		DEBUG_LOG("frame: op %i fin %i len %i\n", opcode, fin ? 1 : 0, (int)len);

		if (masked)
		{
			swapBytes(mask);
			buffer.resize(buffer.length() + 4);
			buffer.resize(buffer.length() - 4);
			int n = buffer.length() / 4 + 1;
			for (int i = 0; i < n; i++)
			{
				((unsigned*)buffer.data())[i] ^= mask;
			}
		}

		switch (opcode)
		{
		case 0: // continuation
		case 1: // text
		case 2: // binary
			msg.append(buffer);
			break;
		case 8: // connection close
		{
			if (buffer.length() >= 2) {
				_code = (buffer[0] << 8) | buffer[1];
				buffer.remove(0, 2);
				msg = buffer;
			}
			haveMsg = true;
			_closed = true;
			_socket.close();
			break;
		}
		case 9: // ping
			send(buffer.data(), buffer.length(), FRAME_PONG);
			break;
		case 10: // pong
			buffer.clear();
			break;
		}

		if (fin)
			haveMsg = true;
	}

	return msg.fix();
}